

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3Fts3HashClear(Fts3Hash *pH)

{
  Fts3HashElem *pFVar1;
  Fts3HashElem *p;
  
  p = pH->first;
  pH->first = (Fts3HashElem *)0x0;
  sqlite3_free(pH->ht);
  pH->ht = (_fts3ht *)0x0;
  pH->htsize = 0;
  while (p != (Fts3HashElem *)0x0) {
    pFVar1 = p->next;
    if ((pH->copyKey != '\0') && (p->pKey != (void *)0x0)) {
      sqlite3_free(p->pKey);
    }
    sqlite3_free(p);
    p = pFVar1;
  }
  pH->count = 0;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3Fts3HashClear(Fts3Hash *pH){
  Fts3HashElem *elem;         /* For looping over all elements of the table */

  assert( pH!=0 );
  elem = pH->first;
  pH->first = 0;
  fts3HashFree(pH->ht);
  pH->ht = 0;
  pH->htsize = 0;
  while( elem ){
    Fts3HashElem *next_elem = elem->next;
    if( pH->copyKey && elem->pKey ){
      fts3HashFree(elem->pKey);
    }
    fts3HashFree(elem);
    elem = next_elem;
  }
  pH->count = 0;
}